

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  long lVar1;
  string *element_name;
  char cVar2;
  char cVar3;
  bool bVar4;
  mapped_type *ppEVar5;
  Type *pTVar6;
  int i_2;
  ulong uVar7;
  EnumValueDescriptor *pEVar8;
  size_t i_1;
  ulong i_00;
  int i;
  long lVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_bool>
  pVar10;
  string error_message;
  string stripped;
  PrefixRemover remover;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>
  local_148;
  key_type local_120;
  undefined1 *local_100;
  ulong local_f8;
  undefined1 local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  StringPiece local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StringPiece local_40;
  
  StringPiece::StringPiece<std::allocator<char>>
            (&local_40,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)result
            );
  local_b0._M_impl._0_8_ = local_40.ptr_;
  local_100 = local_f0;
  local_f8 = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ = local_40.length_;
  local_f0[0] = 0;
  for (lVar9 = 0; lVar9 < (long)local_b0._M_impl.super__Rb_tree_header._M_header._0_8_;
      lVar9 = lVar9 + 1) {
    cVar2 = StringPiece::operator[]((StringPiece *)&local_b0,lVar9);
    if (cVar2 != '_') {
      StringPiece::operator[]((StringPiece *)&local_b0,lVar9);
      std::__cxx11::string::push_back('\0');
    }
  }
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar9 = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (*(int *)(result + 0x2c) <= lVar9) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
      ::~_Rb_tree(&local_b0);
      std::__cxx11::string::~string((string *)&local_100);
      return;
    }
    lVar1 = *(long *)(result + 0x30);
    StringPiece::StringPiece<std::allocator<char>>
              (&local_c0,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar1 + lVar9 * 0x28));
    pEVar8 = (EnumValueDescriptor *)(lVar1 + lVar9 * 0x28);
    local_e0._M_dataplus._M_p = local_c0.ptr_;
    local_e0._M_string_length = local_c0.length_;
    i_00 = 0;
    uVar7 = 0;
    while ((i_00 < local_e0._M_string_length && (uVar7 < local_f8))) {
      cVar2 = StringPiece::operator[]((StringPiece *)&local_e0,i_00);
      if (cVar2 != '_') {
        cVar3 = StringPiece::operator[]((StringPiece *)&local_e0,i_00);
        cVar2 = cVar3 + ' ';
        if (0x19 < (byte)(cVar3 + 0xbfU)) {
          cVar2 = cVar3;
        }
        if (cVar2 != local_100[uVar7]) goto LAB_002e8862;
        uVar7 = uVar7 + 1;
      }
      i_00 = i_00 + 1;
    }
    if (local_f8 <= uVar7) {
      while ((i_00 < local_e0._M_string_length &&
             (cVar2 = StringPiece::operator[]((StringPiece *)&local_e0,i_00), cVar2 == '_'))) {
        i_00 = i_00 + 1;
      }
      if (local_e0._M_string_length != i_00) {
        StringPiece::remove_prefix((StringPiece *)&local_e0,i_00);
      }
    }
LAB_002e8862:
    StringPiece::ToString_abi_cxx11_(&local_148.first,(StringPiece *)&local_e0);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_120);
    for (uVar7 = 0; uVar7 < local_148.first._M_string_length; uVar7 = uVar7 + 1) {
      if (local_148.first._M_dataplus._M_p[uVar7] != '_') {
        std::__cxx11::string::push_back((char)&local_120);
      }
    }
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string((string *)&local_148,(string *)&local_120);
    local_148.second = pEVar8;
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
             ::
             _M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
                         *)&local_b0,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    if (((((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)**(undefined8 **)(pVar10.first._M_node._M_node + 2),
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)pEVar8), bVar4)) &&
       (*(int *)(*(long *)(pVar10.first._M_node._M_node + 2) + 0x10) != *(int *)(pEVar8 + 0x10))) {
      std::operator+(&local_60,"When enum name is stripped and label is PascalCased (",&local_120);
      std::operator+(&local_80,&local_60,"), this value label conflicts with ");
      ppEVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                              *)&local_b0,&local_120);
      std::operator+(&local_e0,&local_80,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*ppEVar5
                    );
      std::operator+(&local_148.first,&local_e0,
                     ". This will make the proto fail to compile for some languages, such as C#.");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      element_name = *(string **)(pEVar8 + 8);
      if (*(int *)(*(long *)(result + 0x10) + 0x8c) == 2) {
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                           (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar9);
        AddWarning(this,element_name,&pTVar6->super_Message,NAME,&local_148.first);
      }
      else {
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                           (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar9);
        AddError(this,element_name,&pTVar6->super_Message,NAME,&local_148.first);
      }
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::__cxx11::string::~string((string *)&local_120);
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  std::map<string, const google::protobuf::EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const google::protobuf::EnumValueDescriptor* value = result->value(i);
    string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    std::pair<std::map<string, const google::protobuf::EnumValueDescriptor*>::iterator,
              bool>
        insert_result = values.insert(std::make_pair(stripped, value));
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      string error_message =
          "When enum name is stripped and label is PascalCased (" + stripped +
          "), this value label conflicts with " + values[stripped]->name() +
          ". This will make the proto fail to compile for some languages, such "
          "as C#.";
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if (result->file()->syntax() == FileDescriptor::SYNTAX_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, error_message);
      } else {
        AddError(value->full_name(), proto.value(i),
                 DescriptorPool::ErrorCollector::NAME, error_message);
      }
    }
  }
}